

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool tinyusdz::CastToXformable(Prim *prim,Xformable **xformable)

{
  GeomMesh *pGVar1;
  
  if (xformable == (Xformable **)0x0) {
    return false;
  }
  pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GPrim>(prim);
  if ((((((((pGVar1 == (GeomMesh *)0x0) &&
           (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::Xform>(prim), pGVar1 == (GeomMesh *)0x0)) &&
          (pGVar1 = Prim::as<tinyusdz::GeomMesh>(prim), pGVar1 == (GeomMesh *)0x0)) &&
         (((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomBasisCurves>(prim),
           pGVar1 == (GeomMesh *)0x0 &&
           (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomCube>(prim), pGVar1 == (GeomMesh *)0x0)) &&
          ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomSphere>(prim), pGVar1 == (GeomMesh *)0x0 &&
           ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomCylinder>(prim), pGVar1 == (GeomMesh *)0x0
            && (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomCone>(prim), pGVar1 == (GeomMesh *)0x0))
           )))))) &&
        (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomCapsule>(prim), pGVar1 == (GeomMesh *)0x0)) &&
       (((((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomPoints>(prim), pGVar1 == (GeomMesh *)0x0 &&
           (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeomCamera>(prim), pGVar1 == (GeomMesh *)0x0))
          && (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::SkelRoot>(prim), pGVar1 == (GeomMesh *)0x0))
         && ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::Skeleton>(prim), pGVar1 == (GeomMesh *)0x0 &&
             (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::RectLight>(prim), pGVar1 == (GeomMesh *)0x0)))
         ) && ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::DomeLight>(prim), pGVar1 == (GeomMesh *)0x0
               && ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::CylinderLight>(prim),
                   pGVar1 == (GeomMesh *)0x0 &&
                   (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::SphereLight>(prim),
                   pGVar1 == (GeomMesh *)0x0)))))))) &&
      ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::DiskLight>(prim), pGVar1 == (GeomMesh *)0x0 &&
       (((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::DistantLight>(prim), pGVar1 == (GeomMesh *)0x0 &&
         (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::RectLight>(prim), pGVar1 == (GeomMesh *)0x0)) &&
        (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::GeometryLight>(prim), pGVar1 == (GeomMesh *)0x0))))
      )) && (((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::PortalLight>(prim), pGVar1 == (GeomMesh *)0x0
              && (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::PluginLight>(prim),
                 pGVar1 == (GeomMesh *)0x0)) &&
             ((pGVar1 = (GeomMesh *)Prim::as<tinyusdz::SkelRoot>(prim), pGVar1 == (GeomMesh *)0x0 &&
              (pGVar1 = (GeomMesh *)Prim::as<tinyusdz::Skeleton>(prim), pGVar1 == (GeomMesh *)0x0)))
             ))) {
    return false;
  }
  *xformable = (Xformable *)pGVar1;
  return true;
}

Assistant:

bool CastToXformable(const Prim &prim, const Xformable **xformable) {
  if (!xformable) {
    return false;
  }

  // __ty = class derived from Xformable.
#define TRY_CAST(__ty)             \
  if (auto pv = prim.as<__ty>()) { \
    (*xformable) = pv;             \
    return true;                   \
  }

  // TODO: Use tydra::ApplyToXformable
  TRY_CAST(GPrim)
  TRY_CAST(Xform)
  TRY_CAST(GeomMesh)
  TRY_CAST(GeomBasisCurves)
  TRY_CAST(GeomCube)
  TRY_CAST(GeomSphere)
  TRY_CAST(GeomCylinder)
  TRY_CAST(GeomCone)
  TRY_CAST(GeomCapsule)
  TRY_CAST(GeomPoints)
  // TRY_CAST(GeomPointInstancer)
  TRY_CAST(GeomCamera)
  TRY_CAST(SkelRoot)
  TRY_CAST(Skeleton)
  TRY_CAST(RectLight)
  TRY_CAST(DomeLight)
  TRY_CAST(CylinderLight)
  TRY_CAST(SphereLight)
  TRY_CAST(DiskLight)
  TRY_CAST(DistantLight)
  TRY_CAST(RectLight)
  TRY_CAST(GeometryLight)
  TRY_CAST(PortalLight)
  TRY_CAST(PluginLight)
  TRY_CAST(SkelRoot)
  TRY_CAST(Skeleton)

  return false;
}